

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::AutoCloseFd::~AutoCloseFd(AutoCloseFd *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for_func local_28;
  Runnable local_20;
  AutoCloseFd *local_18;
  
  if (-1 < this->fd) {
    local_28.this = this;
    bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar1) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_0067d558;
      local_18 = this;
      UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      kj::_::
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++:329:47)>
      ::anon_class_8_1_8991fb9c_for_func::operator()(&local_28);
    }
  }
  return;
}

Assistant:

AutoCloseFd::~AutoCloseFd() noexcept(false) {
  if (fd >= 0) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Don't use SYSCALL() here because close() should not be repeated on EINTR.
      if (miniposix::close(fd) < 0) {
        KJ_FAIL_SYSCALL("close", errno, fd) {
          break;
        }
      }
    });
  }
}